

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVersion.cpp
# Opt level: O0

void __thiscall
utVersion_aiGetBranchNameTest_Test::TestBody(utVersion_aiGetBranchNameTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_50;
  Message local_48 [3];
  char *local_30;
  void *local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  utVersion_aiGetBranchNameTest_Test *this_local;
  
  local_28 = (void *)0x0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_30 = aiGetBranchName();
  testing::internal::CmpHelperNE<decltype(nullptr),char_const*>
            ((internal *)local_20,"nullptr","aiGetBranchName()",&local_28,&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVersion.cpp"
               ,0x4a,message);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST_F( utVersion, aiGetBranchNameTest ) {
    EXPECT_NE( nullptr, aiGetBranchName() );
}